

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>,_2483442811U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>,_2483442811U>
           *this)

{
  int local_15f0;
  result_type local_15ec;
  int iterations;
  result_type x;
  uint *p;
  uint local_15d8 [2];
  uint state [1391];
  WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>,_2483442811U>
  *this_local;
  
  p._4_4_ = 1;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_15d8,0x56f,(int *)((long)&p + 4))
  ;
  _iterations = local_15d8;
  Well<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,Detail::M3<-24>,Detail::M3<30>,Detail::M3<-10>,Detail::M2<-26>,Detail::M1,Detail::M3<20>,Detail::M6<32ul,9u,3072982252u,4227858431u,131072u>,Detail::M1,Detail::MatsumotoKuritaTempering<2480739328u,4195450880u>>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,Detail::M3<_24>,Detail::M3<30>,Detail::M3<_10>,Detail::M2<_26>,Detail::M1,Detail::M3<20>,Detail::M6<32ul,9u,3072982252u,4227858431u,131072u>,Detail::M1,Detail::MatsumotoKuritaTempering<2480739328u,4195450880u>>
              *)this,(uint **)&iterations,state + 0x56d);
  local_15ec = 0;
  local_15f0 = 1000000000;
  while (0 < local_15f0) {
    local_15ec = Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
                 ::operator()(&this->rng);
    local_15f0 = local_15f0 + -1;
  }
  return local_15ec;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }